

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

uint64_t aom_mse_16xh_16bit_c(uint8_t *dst,int dstride,uint16_t *src,int w,int h)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = 0x10 / (long)w & 0xffffffff;
  if ((int)(0x10 / (long)w) < 1) {
    uVar3 = uVar2;
  }
  while ((int)uVar3 != 0) {
    uVar1 = aom_mse_wxh_16bit_c(dst,dstride,src,w,w,h);
    uVar2 = uVar2 + uVar1;
    dst = dst + w;
    src = src + w * h;
    uVar3 = (ulong)((int)uVar3 - 1);
  }
  return uVar2;
}

Assistant:

uint64_t aom_mse_16xh_16bit_c(uint8_t *dst, int dstride, uint16_t *src, int w,
                              int h) {
  uint16_t *src_temp = src;
  uint8_t *dst_temp = dst;
  const int num_blks = 16 / w;
  int64_t sum = 0;
  for (int i = 0; i < num_blks; i++) {
    sum += aom_mse_wxh_16bit_c(dst_temp, dstride, src_temp, w, w, h);
    dst_temp += w;
    src_temp += (w * h);
  }
  return sum;
}